

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O3

IHEVCD_ERROR_T ihevcd_scaling_list_data(codec_t *ps_codec,WORD16 *pi2_scaling_mat)

{
  WORD16 *__dest;
  byte bVar1;
  void *pvVar2;
  WORD16 WVar3;
  WORD16 WVar4;
  UWORD32 UVar5;
  WORD32 WVar6;
  uint uVar7;
  UWORD32 UVar8;
  UWORD32 UVar9;
  int iVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bitstrm_t *ps_bitstrm;
  uint uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  uVar14 = 0;
  do {
    bVar11 = (char)uVar14 * '\x02';
    uVar18 = 0x10 << (bVar11 & 0x1f);
    if (0x3f < uVar18) {
      uVar18 = 0x40;
    }
    uVar19 = (ulong)(uVar18 + (uVar18 == 0));
    uVar15 = uVar14 + 1;
    lVar17 = 0;
    do {
      UVar5 = ihevcd_bits_get(ps_bitstrm,1);
      __dest = pi2_scaling_mat + *(int *)(&DAT_00172590 + (uVar14 * 6 + lVar17) * 4);
      if (UVar5 == 0) {
        UVar8 = ihevcd_uev(ps_bitstrm);
        UVar5 = 0;
        if (0 < (int)UVar8) {
          UVar5 = UVar8;
        }
        UVar9 = (UWORD32)lVar17;
        if ((int)UVar8 <= lVar17) {
          UVar9 = UVar5;
        }
        if (UVar9 != 0) {
          memcpy(__dest,__dest + -(long)(int)(UVar9 << (bVar11 + 4 & 0x1f)),
                 (ulong)(uint)(0x20 << (bVar11 & 0x1f)));
        }
      }
      else if (uVar14 < 2) {
        pvVar2 = gapv_ihevc_invscan[uVar15];
        iVar10 = 8;
        uVar16 = 0;
        do {
          WVar6 = ihevcd_sev(ps_bitstrm);
          uVar7 = WVar6 + iVar10 + 0x100;
          uVar18 = WVar6 + iVar10 + 0x1ff;
          if (-1 < (int)uVar7) {
            uVar18 = uVar7;
          }
          iVar10 = uVar7 - (uVar18 & 0xffffff00);
          __dest[*(byte *)((long)pvVar2 + uVar16)] = (WORD16)iVar10;
          uVar16 = uVar16 + 1;
        } while (uVar19 != uVar16);
      }
      else {
        WVar6 = ihevcd_sev(ps_bitstrm);
        pvVar2 = gapv_ihevc_invscan[2];
        uVar18 = WVar6 + 8;
        WVar3 = (WORD16)uVar18;
        if (uVar14 == 2) {
          uVar16 = 0;
          do {
            WVar6 = ihevcd_sev(ps_bitstrm);
            uVar7 = WVar6 + uVar18 + 0x100;
            uVar18 = WVar6 + uVar18 + 0x1ff;
            if (-1 < (int)uVar7) {
              uVar18 = uVar7;
            }
            uVar18 = uVar7 - (uVar18 & 0xffffff00);
            bVar1 = *(byte *)((long)pvVar2 + uVar16);
            uVar12 = (ulong)(((uint)bVar1 + (uint)bVar1 & 0xe) + (bVar1 & 0xfffffff8) * 4);
            WVar4 = (WORD16)uVar18;
            __dest[uVar12] = WVar4;
            __dest[uVar12 + 1] = WVar4;
            __dest[uVar12 + 0x10] = WVar4;
            __dest[uVar12 + 0x11] = WVar4;
            uVar16 = uVar16 + 1;
          } while (uVar19 != uVar16);
          *__dest = WVar3;
        }
        else {
          uVar16 = 0;
          do {
            WVar6 = ihevcd_sev(ps_bitstrm);
            uVar7 = WVar6 + uVar18 + 0x100;
            uVar18 = WVar6 + uVar18 + 0x1ff;
            if (-1 < (int)uVar7) {
              uVar18 = uVar7;
            }
            uVar18 = uVar7 - (uVar18 & 0xffffff00);
            uVar7 = (uint)*(byte *)((long)pvVar2 + uVar16);
            auVar20 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0);
            lVar13 = 0;
            do {
              *(long *)((long)__dest +
                       lVar13 + (ulong)((uVar7 & 0xffffff8) * 0x10 + (uVar7 & 7) * 4) * 2) =
                   auVar20._0_8_;
              lVar13 = lVar13 + 0x40;
            } while (lVar13 != 0x100);
            *__dest = WVar3;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar19);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != (ulong)(uVar14 != 3) * 4 + 2);
    uVar14 = uVar15;
  } while (uVar15 != 4);
  return 0;
}

Assistant:

IHEVCD_ERROR_T  ihevcd_scaling_list_data(codec_t *ps_codec, WORD16 *pi2_scaling_mat)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 size_id;
    WORD32 matrix_id;
    WORD32 value, dc_value = 0;
    WORD32 next_coef;
    WORD32 coef_num;
    WORD32 i, j, offset;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    WORD16 *pi2_scaling_mat_offset;
    WORD32 scaling_mat_offset[] = { 0, 16, 32, 48, 64, 80, 96, 160, 224, 288, 352, 416, 480, 736, 992, 1248, 1504, 1760, 2016, 3040 };
    UWORD8 *scan_table;

    for(size_id = 0; size_id < 4; size_id++)
    {
        for(matrix_id = 0; matrix_id < ((size_id == 3) ? 2 : 6); matrix_id++)
        {
            WORD32 scaling_list_pred_mode_flag;
            WORD32 scaling_list_delta_coef;
            BITS_PARSE("scaling_list_pred_mode_flag", scaling_list_pred_mode_flag, ps_bitstrm, 1);

            offset = size_id * 6 + matrix_id;
            pi2_scaling_mat_offset = pi2_scaling_mat + scaling_mat_offset[offset];

            if(!scaling_list_pred_mode_flag)
            {
                WORD32 num_elements;
                UEV_PARSE("scaling_list_pred_matrix_id_delta", value,
                          ps_bitstrm);
                value = CLIP3(value, 0, matrix_id);

                num_elements = (1 << (4 + (size_id << 1)));
                if(0 != value)
                    memcpy(pi2_scaling_mat_offset, pi2_scaling_mat_offset - value * num_elements, num_elements * sizeof(WORD16));
            }
            else
            {
                next_coef = 8;
                coef_num = MIN(64, (1 << (4 + (size_id << 1))));

                if(size_id > 1)
                {
                    SEV_PARSE("scaling_list_dc_coef_minus8", value,
                              ps_bitstrm);

                    next_coef = value + 8;
                    dc_value = next_coef;
                }
                if(size_id < 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[size_id + 1];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;
                        pi2_scaling_mat_offset[scan_table[i]] = next_coef;
                    }
                }
                else if(size_id == 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 16 * 2 + (offset & 0x7) * 2;
                        pi2_scaling_mat_offset[offset] = next_coef;
                        pi2_scaling_mat_offset[offset + 1] = next_coef;
                        pi2_scaling_mat_offset[offset + 16] = next_coef;
                        pi2_scaling_mat_offset[offset + 16 + 1] = next_coef;
                    }
                    pi2_scaling_mat_offset[0] = dc_value;
                }
                else
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 32 * 4 + (offset & 0x7) * 4;

                        for(j = 0; j < 4; j++)
                        {
                            pi2_scaling_mat_offset[offset + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 1 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 2 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 3 + j * 32] = next_coef;
                        }
                        pi2_scaling_mat_offset[0] = dc_value;
                    }
                }
            }
        }
    }

    return ret;
}